

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mtc0_maari_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)arg1 & 0x3f;
  uVar1 = 0xf;
  if ((uVar2 == 0x3f) || (uVar1 = uVar2, uVar2 < 0x10)) {
    env->CP0_MAARI = uVar1;
  }
  return;
}

Assistant:

void helper_mtc0_maari(CPUMIPSState *env, target_ulong arg1)
{
    int index = arg1 & 0x3f;
    if (index == 0x3f) {
        /*
         * Software may write all ones to INDEX to determine the
         *  maximum value supported.
         */
        env->CP0_MAARI = MIPS_MAAR_MAX - 1;
    } else if (index < MIPS_MAAR_MAX) {
        env->CP0_MAARI = index;
    }
    /*
     * Other than the all ones, if the value written is not supported,
     * then INDEX is unchanged from its previous value.
     */
}